

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetNumLinConvFails(void *kinmem,long *nlcfails)

{
  KINLsMem pKStack_30;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  long *nlcfails_local;
  void *kinmem_local;
  
  kin_mem = (KINMem)nlcfails;
  nlcfails_local = (long *)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"KINGetNumLinConvFails",(KINMem *)&kinls_mem,&stack0xffffffffffffffd0
                       );
  if (kinmem_local._4_4_ == 0) {
    kin_mem->kin_uround = (realtype)pKStack_30->ncfl;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetNumLinConvFails(void *kinmem, long int *nlcfails)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumLinConvFails",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *nlcfails = kinls_mem->ncfl;
  return(KINLS_SUCCESS);
}